

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O1

double __thiscall Nova::Vector<double,_3,_true>::Normalize(Vector<double,_3,_true> *this)

{
  double dVar1;
  long lVar2;
  double dVar3;
  Vector<double,_3,_true> data_copy;
  Vector<double,_3,_true> local_28;
  
  dVar3 = 0.0;
  lVar2 = 0;
  do {
    dVar1 = *(double *)((long)(this->_data)._M_elems + lVar2);
    dVar3 = dVar3 + dVar1 * dVar1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    Vector(&local_28,this);
    lVar2 = 0;
    do {
      *(double *)((long)local_28._data._M_elems + lVar2) =
           *(double *)((long)local_28._data._M_elems + lVar2) * (1.0 / dVar3);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x18);
    (this->_data)._M_elems[2] = local_28._data._M_elems[2];
    (this->_data)._M_elems[0] = local_28._data._M_elems[0];
    (this->_data)._M_elems[1] = local_28._data._M_elems[1];
  }
  else {
    Vector(&local_28);
    (this->_data)._M_elems[2] = local_28._data._M_elems[2];
    (this->_data)._M_elems[0] = 1.0;
    (this->_data)._M_elems[1] = local_28._data._M_elems[1];
  }
  return dVar3;
}

Assistant:

T Normalize()
    {
        T norm=Norm();
        if(norm) *this=this->operator*((T)1./norm);
        else *this=Axis_Vector(0);
        return norm;
    }